

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_outputParameters_differentType_TestShell::
~TEST_MockSupport_c_outputParameters_differentType_TestShell
          (TEST_MockSupport_c_outputParameters_differentType_TestShell *this)

{
  TEST_MockSupport_c_outputParameters_differentType_TestShell *this_local;
  
  ~TEST_MockSupport_c_outputParameters_differentType_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupport_c, outputParameters_differentType)
{
    long param = 1;
    const long retval = 2;
    mock_c()->expectOneCall("foo")->withOutputParameterReturning("out", &retval, sizeof(retval));
    mock_c()->actualCall("foo")->withOutputParameter("out", &param);
    mock_c()->checkExpectations();
    LONGS_EQUAL(2, param);
    LONGS_EQUAL(2, retval);
}